

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_match(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int atom)

{
  JSValueUnion JVar1;
  JSValue val;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue this_val_00;
  JSValue v_02;
  JSValue func_obj;
  JSValue this_obj;
  JSValue func_obj_00;
  JSValue regexp_00;
  JSValue v_03;
  JSValue JVar2;
  JSValue JVar3;
  int iVar4;
  int iVar5;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue *in_R8;
  int in_R9D;
  JSValue JVar6;
  int64_t unaff_retaddr;
  int args_len;
  JSValue str;
  JSValue result;
  JSValue rx;
  JSValue S;
  JSValue matcher;
  JSValue args [2];
  JSValue regexp;
  JSValue O;
  int in_stack_fffffffffffffe88;
  JSAtom in_stack_fffffffffffffe8c;
  JSContext *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  JSValueUnion in_stack_fffffffffffffea0;
  JSValueUnion in_stack_fffffffffffffea8;
  JSValueUnion in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  JSValueUnion in_stack_fffffffffffffec8;
  int64_t in_stack_fffffffffffffed0;
  JSValueUnion in_stack_fffffffffffffed8;
  JSValueUnion ctx_00;
  int64_t iVar7;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  JSValue *in_stack_ffffffffffffff00;
  JSValueUnion JVar8;
  JSValueUnion local_b8 [3];
  undefined1 local_40 [8];
  int64_t local_38;
  int64_t in_stack_fffffffffffffff0;
  JSValueUnion in_stack_fffffffffffffff8;
  
  JVar8 = (JSValueUnion)(in_R8->u).ptr;
  JVar1 = (JSValueUnion)in_R8->tag;
  JVar3 = *in_R8;
  JVar2 = *in_R8;
  JVar6.tag = in_RDX;
  JVar6.u.ptr = in_RSI.ptr;
  iVar4 = JS_IsUndefined(JVar6);
  if ((iVar4 != 0) ||
     (v_03.tag = in_RDX, v_03.u.ptr = in_RSI.ptr, iVar4 = JS_IsNull(v_03), iVar4 != 0)) {
    JVar6 = JS_ThrowTypeError(in_RDI,"cannot convert to object");
    return JVar6;
  }
  iVar4 = JS_IsUndefined(JVar2);
  if ((iVar4 == 0) && (iVar4 = JS_IsNull(JVar3), iVar4 == 0)) {
    in_stack_fffffffffffffe88 = 0;
    JVar3.tag = unaff_retaddr;
    JVar3.u.float64 = in_stack_fffffffffffffff8.float64;
    JVar2.tag = in_stack_fffffffffffffff0;
    JVar2.u = (JSValueUnion)(JSValueUnion)JVar1.ptr;
    JVar6 = JS_GetPropertyInternal
                      ((JSContext *)JVar8.ptr,JVar3,(JSAtom)((ulong)in_RDI >> 0x20),JVar2,
                       result.u.int32);
    ctx_00 = JVar6.u;
    iVar7 = JVar6.tag;
    iVar4 = JS_IsException(JVar6);
    if (iVar4 != 0) {
      local_40 = (undefined1  [8])(stack0xffffffffffffffc4 << 0x20);
      local_38 = 6;
      return _local_40;
    }
    if ((in_R9D == 200) &&
       (regexp_00.tag._0_4_ = in_stack_fffffffffffffef0, regexp_00.u = (JSValueUnion)iVar7,
       regexp_00.tag._4_4_ = in_stack_fffffffffffffef4,
       iVar4 = check_regexp_g_flag((JSContext *)ctx_00.ptr,regexp_00), iVar4 < 0)) {
      v.u._4_4_ = in_stack_fffffffffffffe9c;
      v.u.int32 = in_stack_fffffffffffffe98;
      v.tag = (int64_t)in_stack_fffffffffffffea0.ptr;
      JS_FreeValue(in_stack_fffffffffffffe90,v);
      local_40 = (undefined1  [8])(stack0xffffffffffffffc4 << 0x20);
      local_38 = 6;
      return _local_40;
    }
    iVar4 = JS_IsUndefined(JVar6);
    if ((iVar4 == 0) && (iVar4 = JS_IsNull(JVar6), iVar4 == 0)) {
      func_obj_00.tag = (int64_t)ctx_00.ptr;
      func_obj_00.u.float64 = in_stack_fffffffffffffed8.float64;
      this_obj.tag = in_stack_fffffffffffffed0;
      this_obj.u.float64 = in_stack_fffffffffffffec8.float64;
      JVar6 = JS_CallFree((JSContext *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                          ,func_obj_00,this_obj,in_stack_fffffffffffffebc,in_stack_ffffffffffffff00)
      ;
      return JVar6;
    }
  }
  val.u._4_4_ = in_stack_fffffffffffffe8c;
  val.u.int32 = in_stack_fffffffffffffe88;
  val.tag = (int64_t)in_stack_fffffffffffffe90;
  JVar6 = JS_ToString((JSContext *)0x1b943c,val);
  iVar4 = JS_IsException(JVar6);
  if (iVar4 != 0) {
    local_40 = (undefined1  [8])(stack0xffffffffffffffc4 << 0x20);
    local_38 = 6;
    return _local_40;
  }
  iVar4 = 1;
  local_b8[0] = JVar8;
  local_b8[1] = JVar1;
  if (in_R9D == 200) {
    JVar6 = JS_NewString((JSContext *)in_stack_fffffffffffffea0.ptr,
                         (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    JVar8 = (JSValueUnion)JVar6.tag;
    in_stack_fffffffffffffeb0 = JVar6.u;
    iVar5 = JS_IsException(JVar6);
    if (iVar5 != 0) goto LAB_001b95ee;
    local_b8[(long)iVar4 * 2].ptr = (void *)JVar6.u;
    local_b8[(long)iVar4 * 2 + 1] = JVar8;
  }
  func_obj.tag = (int64_t)in_stack_fffffffffffffeb0.ptr;
  func_obj.u.float64 = in_stack_fffffffffffffea8.float64;
  JVar6 = JS_CallConstructor((JSContext *)in_stack_fffffffffffffea0.ptr,func_obj,
                             in_stack_fffffffffffffe9c,(JSValue *)in_stack_fffffffffffffe90);
  in_stack_fffffffffffffea0 = JVar6.u;
  v_00.u._4_4_ = in_stack_fffffffffffffe9c;
  v_00.u.int32 = in_stack_fffffffffffffe98;
  v_00.tag = (int64_t)in_stack_fffffffffffffea0.ptr;
  JS_FreeValue(in_stack_fffffffffffffe90,v_00);
  iVar4 = JS_IsException(JVar6);
  if (iVar4 == 0) {
    this_val_00.u._4_4_ = in_stack_fffffffffffffe9c;
    this_val_00.u.int32 = in_stack_fffffffffffffe98;
    this_val_00.tag = (int64_t)in_stack_fffffffffffffea0.ptr;
    JVar6 = JS_InvokeFree(in_stack_fffffffffffffe90,this_val_00,in_stack_fffffffffffffe8c,
                          in_stack_fffffffffffffe88,(JSValue *)0x1b9659);
    v_02.tag = (int64_t)in_stack_fffffffffffffea0.ptr;
    v_02.u = (JSValueUnion)(JSValueUnion)JVar6.tag;
    JS_FreeValue((JSContext *)JVar6.u.ptr,v_02);
    return JVar6;
  }
LAB_001b95ee:
  v_01.u._4_4_ = in_stack_fffffffffffffe9c;
  v_01.u.int32 = in_stack_fffffffffffffe98;
  v_01.tag = (int64_t)in_stack_fffffffffffffea0.ptr;
  JS_FreeValue(in_stack_fffffffffffffe90,v_01);
  local_40 = (undefined1  [8])(stack0xffffffffffffffc4 << 0x20);
  local_38 = 6;
  return _local_40;
}

Assistant:

static JSValue js_string_match(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int atom)
{
    // match(rx), search(rx), matchAll(rx)
    // atom is JS_ATOM_Symbol_match, JS_ATOM_Symbol_search, or JS_ATOM_Symbol_matchAll
    JSValueConst O = this_val, regexp = argv[0], args[2];
    JSValue matcher, S, rx, result, str;
    int args_len;

    if (JS_IsUndefined(O) || JS_IsNull(O))
        return JS_ThrowTypeError(ctx, "cannot convert to object");

    if (!JS_IsUndefined(regexp) && !JS_IsNull(regexp)) {
        matcher = JS_GetProperty(ctx, regexp, atom);
        if (JS_IsException(matcher))
            return JS_EXCEPTION;
        if (atom == JS_ATOM_Symbol_matchAll) {
            if (check_regexp_g_flag(ctx, regexp) < 0) {
                JS_FreeValue(ctx, matcher);
                return JS_EXCEPTION;
            }
        }
        if (!JS_IsUndefined(matcher) && !JS_IsNull(matcher)) {
            return JS_CallFree(ctx, matcher, regexp, 1, &O);
        }
    }
    S = JS_ToString(ctx, O);
    if (JS_IsException(S))
        return JS_EXCEPTION;
    args_len = 1;
    args[0] = regexp;
    str = JS_UNDEFINED;
    if (atom == JS_ATOM_Symbol_matchAll) {
        str = JS_NewString(ctx, "g");
        if (JS_IsException(str))
            goto fail;
        args[args_len++] = (JSValueConst)str;
    }
    rx = JS_CallConstructor(ctx, ctx->regexp_ctor, args_len, args);
    JS_FreeValue(ctx, str);
    if (JS_IsException(rx)) {
    fail:
        JS_FreeValue(ctx, S);
        return JS_EXCEPTION;
    }
    result = JS_InvokeFree(ctx, rx, atom, 1, (JSValueConst *)&S);
    JS_FreeValue(ctx, S);
    return result;
}